

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O0

Dec_Edge_t Dec_GraphAddNodeXor(Dec_Graph_t *pGraph,Dec_Edge_t eEdge0,Dec_Edge_t eEdge1,int Type)

{
  Dec_Edge_t DVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t eNode1;
  Dec_Edge_t eNode0;
  int Type_local;
  Dec_Graph_t *pGraph_local;
  Dec_Edge_t eEdge1_local;
  Dec_Edge_t eEdge0_local;
  Dec_Edge_t eNode;
  
  if (Type == 0) {
    DVar1 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)
                                       ((uint)eEdge0 & 0xfffffffe | (uint)eEdge0 & 1 ^ 1),eEdge1);
    DVar2 = Dec_GraphAddNodeAnd(pGraph,eEdge0,
                                (Dec_Edge_t)((uint)eEdge1 & 0xfffffffe | (uint)eEdge1 & 1 ^ 1));
    eEdge1_local = Dec_GraphAddNodeOr(pGraph,DVar1,DVar2);
  }
  else {
    DVar1 = Dec_GraphAddNodeAnd(pGraph,eEdge0,eEdge1);
    DVar2 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)
                                       ((uint)eEdge0 & 0xfffffffe | (uint)eEdge0 & 1 ^ 1),
                                (Dec_Edge_t)((uint)eEdge1 & 0xfffffffe | (uint)eEdge1 & 1 ^ 1));
    DVar1 = Dec_GraphAddNodeOr(pGraph,DVar1,DVar2);
    eEdge1_local = (Dec_Edge_t)((uint)DVar1 & 0xfffffffe | (uint)DVar1 & 1 ^ 1);
  }
  return eEdge1_local;
}

Assistant:

static inline Dec_Edge_t Dec_GraphAddNodeXor( Dec_Graph_t * pGraph, Dec_Edge_t eEdge0, Dec_Edge_t eEdge1, int Type )
{
    Dec_Edge_t eNode0, eNode1, eNode;
    if ( Type == 0 )
    {
        // derive the first AND
        eEdge0.fCompl ^= 1;
        eNode0 = Dec_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        eEdge0.fCompl ^= 1;
        // derive the second AND
        eEdge1.fCompl ^= 1;
        eNode1 = Dec_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the final OR
        eNode = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    }
    else
    {
        // derive the first AND
        eNode0 = Dec_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the second AND
        eEdge0.fCompl ^= 1;
        eEdge1.fCompl ^= 1;
        eNode1 = Dec_GraphAddNodeAnd( pGraph, eEdge0, eEdge1 );
        // derive the final OR
        eNode = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        eNode.fCompl ^= 1;
    }
    return eNode;
}